

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefiledeps.cpp
# Opt level: O1

void __thiscall
QMakeSourceFileInfo::addSourceFile
          (QMakeSourceFileInfo *this,QString *f,uchar seek,SourceFileType type)

{
  int n;
  SourceFiles *pSVar1;
  SourceFileNode **ppSVar2;
  long lVar3;
  SourceFile *p;
  char *file;
  long in_FS_OFFSET;
  QMakeLocalFileName local_88;
  QArrayData *local_50;
  char *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->files == (SourceFiles *)0x0) {
    pSVar1 = (SourceFiles *)operator_new(0x10);
    pSVar1->num_nodes = 0xbdd;
    ppSVar2 = (SourceFileNode **)malloc(0x5ee8);
    pSVar1->nodes = ppSVar2;
    lVar3 = 0;
    do {
      pSVar1->nodes[lVar3] = (SourceFileNode *)0x0;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0xbdd);
    this->files = pSVar1;
  }
  local_88.real_name.d.d = (f->d).d;
  local_88.real_name.d.ptr = (f->d).ptr;
  local_88.real_name.d.size = (f->d).size;
  if (&(local_88.real_name.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((local_88.real_name.d.d)->super_QArrayData).ref_)->ref_)._q_value.
    super___atomic_base<int>._M_i =
         (((QArrayData *)&((local_88.real_name.d.d)->super_QArrayData).ref_)->ref_)._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_88.local_name.d.d = (Data *)0x0;
  local_88.local_name.d.ptr = (char16_t *)0x0;
  local_88.local_name.d.size = 0;
  pSVar1 = this->files;
  QMakeLocalFileName::local(&local_88);
  QString::toLatin1_helper((QString *)&local_50);
  file = local_48;
  if (local_48 == (char *)0x0) {
    file = (char *)&QByteArray::_empty;
  }
  p = SourceFiles::lookupFile(pSVar1,file);
  if (local_50 != (QArrayData *)0x0) {
    LOCK();
    (local_50->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_50,1,0x10);
    }
  }
  if (p == (SourceFile *)0x0) {
    p = (SourceFile *)operator_new(0x40);
    (p->file).real_name.d.d = (Data *)0x0;
    (p->file).real_name.d.ptr = (char16_t *)0x0;
    (p->file).real_name.d.size = 0;
    (p->file).local_name.d.d = (Data *)0x0;
    (p->file).local_name.d.ptr = (char16_t *)0x0;
    (p->file).local_name.d.size = 0;
    *(undefined8 *)((long)&(p->file).local_name.d.size + 4) = 0;
    *(undefined8 *)((long)&p->deps + 4) = 0;
    p->field_0x3c = p->field_0x3c & 0xe0 | 4;
    p->included_count = '\0';
    QString::operator=((QString *)p,(QString *)&local_88);
    QString::operator=(&(p->file).local_name,(QString *)&local_88.local_name);
    SourceFiles::addFile(this->files,p,(char *)0x0,true);
  }
  else if (((p->type != type) && (type != TYPE_UNKNOWN)) && (p->type != TYPE_UNKNOWN)) {
    QString::toLatin1_helper((QString *)&local_50);
    if (local_48 == (char *)0x0) {
      local_48 = (char *)&QByteArray::_empty;
    }
    warn_msg(WarnLogic,"%s is marked as %d, then %d!",local_48,(ulong)p->type,(ulong)type);
    if (local_50 != (QArrayData *)0x0) {
      LOCK();
      (local_50->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_50,1,0x10);
      }
    }
  }
  if (type != TYPE_UNKNOWN) {
    p->type = type;
  }
  if (((seek & 2) != 0) && ((p->field_0x3c & 8) == 0)) {
    findMocs(this,p);
  }
  if (((seek & 1) != 0) && ((p->field_0x3c & 0x10) == 0)) {
    findDeps(this,p);
  }
  if (&(local_88.local_name.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.local_name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.local_name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_88.local_name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_88.local_name.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_88.real_name.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.real_name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.real_name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_88.real_name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_88.real_name.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMakeSourceFileInfo::addSourceFile(const QString &f, uchar seek,
                                        QMakeSourceFileInfo::SourceFileType type)
{
    if(!files)
        files = new SourceFiles;

    QMakeLocalFileName fn(f);
    SourceFile *file = files->lookupFile(fn);
    if(!file) {
        file = new SourceFile;
        file->file = fn;
        files->addFile(file);
    } else {
        if(file->type != type && file->type != TYPE_UNKNOWN && type != TYPE_UNKNOWN)
            warn_msg(WarnLogic, "%s is marked as %d, then %d!", f.toLatin1().constData(),
                     file->type, type);
    }
    if(type != TYPE_UNKNOWN)
        file->type = type;

    if(seek & SEEK_MOCS && !file->moc_checked)
        findMocs(file);
    if(seek & SEEK_DEPS && !file->dep_checked)
        findDeps(file);
}